

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O1

string * __thiscall
cmInstallCommand::GetDestination
          (string *__return_storage_ptr__,cmInstallCommand *this,cmInstallCommandArguments *args,
          string *varName,string *guess)

{
  pointer pcVar1;
  string *psVar2;
  string val;
  char *local_48;
  size_type local_40;
  char local_38;
  undefined7 uStack_37;
  undefined8 uStack_30;
  
  if ((args != (cmInstallCommandArguments *)0x0) &&
     (psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args),
     psVar2->_M_string_length != 0)) {
    psVar2 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar2->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar2->_M_string_length);
    return __return_storage_ptr__;
  }
  psVar2 = cmMakefile::GetSafeDefinition((this->super_cmCommand).Makefile,varName);
  pcVar1 = (psVar2->_M_dataplus)._M_p;
  local_48 = &local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + psVar2->_M_string_length);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_40 == 0) {
    pcVar1 = (guess->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + guess->_M_string_length);
  }
  else {
    if (local_48 == &local_38) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_30;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_48;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_37,local_38);
    }
    __return_storage_ptr__->_M_string_length = local_40;
    local_40 = 0;
    local_38 = '\0';
    local_48 = &local_38;
  }
  if (local_48 != &local_38) {
    operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmInstallCommand::GetDestination(
  const cmInstallCommandArguments* args, const std::string& varName,
  const std::string& guess)
{
  if (args && !args->GetDestination().empty()) {
    return args->GetDestination();
  }
  std::string val = this->Makefile->GetSafeDefinition(varName);
  if (!val.empty()) {
    return val;
  }
  return guess;
}